

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

ElOrderType M_GetElOrder(Matrix *M)

{
  LASErrIdType LVar1;
  ElOrderType EVar2;
  
  LVar1 = LASResult();
  EVar2 = Rowws;
  if (LVar1 == LASOK) {
    EVar2 = M->ElOrder;
  }
  return EVar2;
}

Assistant:

ElOrderType M_GetElOrder(Matrix *M)
/* returns the element order */
{
    ElOrderType ElOrder;

    if (LASResult() == LASOK) {
        ElOrder = M->ElOrder;
    } else {
        ElOrder = (ElOrderType)0;
    }
    return(ElOrder);
}